

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  long in_RDI;
  ZSTD_paramSwitch_e useRowMatchFinder;
  ZSTD_compressionParameters cParams;
  size_t in_stack_000000c0;
  size_t in_stack_000000c8;
  ZSTD_paramSwitch_e in_stack_000000d0;
  int in_stack_000000d4;
  ldmParams_t *in_stack_000000d8;
  ZSTD_compressionParameters *in_stack_000000e0;
  U64 in_stack_000000f0;
  int in_stack_000000f8;
  size_t in_stack_00000100;
  ZSTD_compressionParameters *in_stack_ffffffffffffffb8;
  ZSTD_paramSwitch_e in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  ZSTD_getCParamsFromCCtxParams
            ((ZSTD_CCtx_params *)cParams._20_8_,cParams._12_8_,cParams._4_8_,cParams.windowLog);
  ZSTD_resolveRowMatchFinderMode(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(int *)(in_RDI + 0x4c) < 1) {
    local_8 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                        (in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,
                         in_stack_000000c8,in_stack_000000c0,in_stack_000000f0,in_stack_000000f8,
                         in_stack_00000100);
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
    ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder,
                                                                               &cParams);

    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    /* estimateCCtxSize is for one-shot compression. So no buffers should
     * be needed. However, we still allocate two 0-sized buffers, which can
     * take space under ASAN. */
    return ZSTD_estimateCCtxSize_usingCCtxParams_internal(
        &cParams, &params->ldmParams, 1, useRowMatchFinder, 0, 0, ZSTD_CONTENTSIZE_UNKNOWN, params->useSequenceProducer, params->maxBlockSize);
}